

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

void __thiscall
Diligent::RefCntWeakPtr<Diligent::IAsyncTask>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::IAsyncTask> *this,RefCntAutoPtr<Diligent::IAsyncTask> *AutoPtr)

{
  int iVar1;
  undefined4 extraout_var;
  RefCountersImpl *pSrcPtr;
  
  if (AutoPtr->m_pObject == (IAsyncTask *)0x0) {
    pSrcPtr = (RefCountersImpl *)0x0;
  }
  else {
    iVar1 = (*(AutoPtr->m_pObject->super_IObject)._vptr_IObject[3])();
    pSrcPtr = (RefCountersImpl *)CONCAT44(extraout_var,iVar1);
    if (pSrcPtr != (RefCountersImpl *)0x0) {
      CheckDynamicType<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                ((IReferenceCounters *)pSrcPtr);
    }
  }
  this->m_pRefCounters = pSrcPtr;
  this->m_pObject = AutoPtr->m_pObject;
  if (pSrcPtr != (RefCountersImpl *)0x0) {
    LOCK();
    (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i =
         (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(RefCntAutoPtr<T>& AutoPtr) noexcept :
        m_pRefCounters{AutoPtr ? ClassPtrCast<RefCountersImpl>(AutoPtr->GetReferenceCounters()) : nullptr},
        m_pObject{static_cast<T*>(AutoPtr)}
    {
        if (m_pRefCounters)
            m_pRefCounters->AddWeakRef();
    }